

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string_t * __thiscall pugi::xpath_query::evaluate_string_abi_cxx11_(xpath_query *this,xpath_node *n)

{
  undefined8 uVar1;
  char_t *pcVar2;
  xpath_stack_data *this_00;
  xpath_node *in_RDX;
  long *in_RSI;
  string_t *in_RDI;
  xpath_string r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_stack_data *in_stack_ffffffffffffdf00;
  allocator local_20c5 [13];
  xpath_string local_20b8 [60];
  xpath_stack *in_stack_ffffffffffffe4f0;
  xpath_context *in_stack_ffffffffffffe4f8;
  xpath_ast_node *in_stack_ffffffffffffe500;
  byte local_40;
  xpath_context local_38;
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    impl::anon_unknown_0::xpath_context::xpath_context(&local_38,in_RDX,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data(in_stack_ffffffffffffdf00);
    impl::anon_unknown_0::xpath_ast_node::eval_string
              (in_stack_ffffffffffffe500,in_stack_ffffffffffffe4f8,in_stack_ffffffffffffe4f0);
    if ((local_40 & 1) != 0) {
      uVar1 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)in_stack_ffffffffffffdf00);
      __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pcVar2 = impl::anon_unknown_0::xpath_string::c_str(local_20b8);
    this_00 = (xpath_stack_data *)
              impl::anon_unknown_0::xpath_string::length((xpath_string *)in_stack_ffffffffffffdf00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar2,(ulong)this_00,local_20c5);
    std::allocator<char>::~allocator((allocator<char> *)local_20c5);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(this_00);
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN string_t xpath_query::evaluate_string(const xpath_node& n) const
	{
		if (!_impl) return string_t();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return string_t();
		#else
			throw std::bad_alloc();
		#endif
		}

		return string_t(r.c_str(), r.length());
	}